

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_AllLite33_Test<absl::lts_20250127::Cord>::TestBody
          (LiteTest_AllLite33_Test<absl::lts_20250127::Cord> *this)

{
  bool bVar1;
  char *pcVar2;
  UntypedMapBase *this_00;
  Map<int,_int> *this_01;
  int *rhs;
  char *in_R9;
  AssertHelper local_358;
  Message local_350;
  key_arg<int> local_348;
  int local_344;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_328;
  Message local_320;
  size_type local_318;
  int local_30c;
  undefined1 local_308 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2d8;
  Message local_2d0;
  string_view local_2c8;
  bool local_2b1;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_;
  allocator<char> local_289;
  string local_288 [8];
  string data;
  TestMapLite message;
  LiteTest_AllLite33_Test<absl::lts_20250127::Cord> *this_local;
  
  proto2_unittest::TestMapLite::TestMapLite((TestMapLite *)((long)&data.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_288,"\n\x04\b\x01\x10\x01",&local_289);
  std::allocator<char>::~allocator(&local_289);
  local_2c8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_288);
  local_2b1 = MessageLite::ParseFromString((MessageLite *)((long)&data.field_2 + 8),local_2c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b0,&local_2b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_2b0,
               (AssertionResult *)"message.ParseFromString(data)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x2fb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  local_30c = 1;
  this_00 = (UntypedMapBase *)
            proto2_unittest::TestMapLite::map_int32_int32((TestMapLite *)((long)&data.field_2 + 8));
  local_318 = internal::UntypedMapBase::size(this_00);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_308,"1","message.map_int32_int32().size()",&local_30c,&local_318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x2fc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    testing::Message::~Message(&local_320);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_344 = 1;
    this_01 = proto2_unittest::TestMapLite::map_int32_int32
                        ((TestMapLite *)((long)&data.field_2 + 8));
    local_348 = 1;
    rhs = Map<int,_int>::at<int>(this_01,&local_348);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_340,"1","message.map_int32_int32().at(1)",&local_344,rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
    if (!bVar1) {
      testing::Message::Message(&local_350);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
      testing::internal::AssertHelper::AssertHelper
                (&local_358,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                 ,0x2fd,pcVar2);
      testing::internal::AssertHelper::operator=(&local_358,&local_350);
      testing::internal::AssertHelper::~AssertHelper(&local_358);
      testing::Message::~Message(&local_350);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  std::__cxx11::string::~string(local_288);
  proto2_unittest::TestMapLite::~TestMapLite((TestMapLite *)((long)&data.field_2 + 8));
  return;
}

Assistant:

TYPED_TEST(LiteTest, AllLite33) {
  {
    // StandardWireFormat
    proto2_unittest::TestMapLite message;
    std::string data = "\x0A\x04\x08\x01\x10\x01";

    EXPECT_TRUE(message.ParseFromString(data));
    ASSERT_EQ(1, message.map_int32_int32().size());
    EXPECT_EQ(1, message.map_int32_int32().at(1));
  }
}